

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_update_teleport_tree_connections.hpp
# Opt level: O2

void __thiscall
PatchUpdateTeleportTreeConnections::inject_code
          (PatchUpdateTeleportTreeConnections *this,ROM *rom,World *world)

{
  _Base_ptr p_Var1;
  long lVar2;
  _Base_ptr p_Var3;
  LandstalkerException *this_00;
  pair<WorldTeleportTree_*,_WorldTeleportTree_*> *pair;
  _Base_ptr p_Var4;
  allocator<char> local_89;
  ByteArray bytes;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_68;
  string local_50;
  
  bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  p_Var1 = world[2]._entity_types._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
  for (p_Var4 = world[2]._entity_types._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var4 != p_Var1; p_Var4 = (_Base_ptr)&p_Var4->_M_left) {
    lVar2 = *(long *)p_Var4;
    p_Var3 = p_Var4->_M_parent;
    ByteArray::add_word(&bytes,*(uint16_t *)(lVar2 + 0x20));
    ByteArray::add_byte(&bytes,*(uint8_t *)&p_Var3[2]._M_left);
    ByteArray::add_byte(&bytes,*(uint8_t *)((long)&p_Var3[2]._M_left + 2));
    ByteArray::add_word(&bytes,(short)p_Var3[1]._M_color);
    ByteArray::add_byte(&bytes,*(uint8_t *)(lVar2 + 0x50));
    ByteArray::add_byte(&bytes,*(uint8_t *)(lVar2 + 0x52));
  }
  ByteArray::add_word(&bytes,0xffff);
  if ((long)bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start == 0x2a) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_68,
               &bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>);
    md::ROM::set_bytes(rom,0x5102,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_68
                      );
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_68);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&bytes);
    return;
  }
  this_00 = (LandstalkerException *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"Teleport tree flags array has a different size from vanilla game."
             ,&local_89);
  LandstalkerException::LandstalkerException(this_00,&local_50);
  __cxa_throw(this_00,&LandstalkerException::typeinfo,LandstalkerException::~LandstalkerException);
}

Assistant:

void inject_code(md::ROM& rom, World& world) override
    {
        constexpr uint32_t TELEPORT_TREE_FLAGS_TABLE_ADDR = 0x5102;
        ByteArray bytes;

        RandomizerWorld& randomizer_world = reinterpret_cast<RandomizerWorld&>(world);
        for(const auto& pair : randomizer_world.teleport_tree_pairs())
        {
            WorldTeleportTree* tree_1 = pair.first;
            WorldTeleportTree* tree_2 = pair.second;

            bytes.add_word(tree_1->map_id());
            bytes.add_byte((uint8_t)tree_2->flag().byte);
            bytes.add_byte(tree_2->flag().bit);

            bytes.add_word(tree_2->map_id());
            bytes.add_byte((uint8_t)tree_1->flag().byte);
            bytes.add_byte(tree_1->flag().bit);
        }
        bytes.add_word(0xFFFF);

        if(bytes.size() != 0x2A)
            throw LandstalkerException("Teleport tree flags array has a different size from vanilla game.");
        rom.set_bytes(TELEPORT_TREE_FLAGS_TABLE_ADDR, bytes);
    }